

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O0

void cpp_wrapper_static_open_close_complex
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value)

{
  ion_dictionary_id_t iVar1;
  int32_t actual;
  int32_t actual_00;
  ion_key_type_t iVar2;
  ion_dictionary_size_t iVar3;
  ion_dictionary_type_t iVar4;
  ion_dictionary_config_info_t config_info;
  ulong uVar5;
  ion_dictionary_config_info_t config_info_00;
  ion_dictionary_config_info_t config_info_01;
  ion_dictionary_config_info_t config_info_02;
  ion_dictionary_config_info_t config_info_03;
  ion_dictionary_config_info_t config_info_04;
  ion_dictionary_config_info_t config_info_05;
  ion_dictionary_config_info_t config_info_06;
  ion_dictionary_config_info_t config_info_07;
  ion_dictionary_config_info_t config_info_08;
  ion_dictionary_config_info_t config_info_09;
  ion_dictionary_config_info_t config_info_10;
  ion_dictionary_config_info_t config_info_11;
  ion_dictionary_config_info_t config_info_12;
  ulong uVar6;
  planck_unit_result_t pVar7;
  int iVar8;
  Dictionary<int,_int> *pDVar9;
  int type;
  ion_dictionary_config_info_t config;
  ion_dictionary_type_t dict_type;
  ion_dictionary_size_t dict_size;
  ion_key_type_t key_type;
  ion_value_size_t val_size;
  ion_key_size_t key_size;
  ion_dictionary_id_t gdict_id;
  ion_err_t error;
  int value_local;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  iVar1 = ((dict->dict).instance)->id;
  actual = (((dict->dict).instance)->record).key_size;
  actual_00 = (((dict->dict).instance)->record).value_size;
  iVar2 = ((dict->dict).instance)->key_type;
  iVar3 = dict->dict_size;
  iVar4 = ((dict->dict).instance)->type;
  cpp_wrapper_insert(tc,dict,key,value,'\0');
  cpp_wrapper_insert(tc,dict,key + 10,value + 10,'\0');
  cpp_wrapper_get(tc,dict,key,value,'\0',1);
  cpp_wrapper_get(tc,dict,key + 10,value + 10,'\0',1);
  pDVar9 = dict;
  cpp_wrapper_get(tc,dict,key + -10,value + -10,'\x01',0);
  iVar8 = Dictionary<int,_int>::close(dict,(int)pDVar9);
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(char)iVar8,0x9a,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  _value_local = dict;
  switch(iVar4) {
  case dictionary_type_bpp_tree_t:
    config_info.key_size = actual;
    config_info.type = iVar2;
    config_info.dictionary_size = iVar3;
    config_info.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info.id = (int)uVar5;
    config_info.use_type = (char)(uVar5 >> 0x20);
    config_info._5_3_ = (int3)(uVar5 >> 0x28);
    config_info.dictionary_type = (int)uVar6;
    config_info.dictionary_status = (char)(uVar6 >> 0x20);
    config_info._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &BppTree<int,_int>::openDictionary(config_info,0,0)->super_Dictionary<int,_int>;
    break;
  case dictionary_type_flat_file_t:
    config_info_00.key_size = actual;
    config_info_00.type = iVar2;
    config_info_00.dictionary_size = iVar3;
    config_info_00.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_00.id = (int)uVar5;
    config_info_00.use_type = (char)(uVar5 >> 0x20);
    config_info_00._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_00.dictionary_type = (int)uVar6;
    config_info_00.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_00._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &FlatFile<int,_int>::openDictionary(config_info_00,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_open_address_file_hash_t:
    config_info_03.key_size = actual;
    config_info_03.type = iVar2;
    config_info_03.dictionary_size = iVar3;
    config_info_03.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_03.id = (int)uVar5;
    config_info_03.use_type = (char)(uVar5 >> 0x20);
    config_info_03._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_03.dictionary_type = (int)uVar6;
    config_info_03.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_03._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &OpenAddressFileHash<int,_int>::openDictionary(config_info_03,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_open_address_hash_t:
    config_info_02.key_size = actual;
    config_info_02.type = iVar2;
    config_info_02.dictionary_size = iVar3;
    config_info_02.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_02.id = (int)uVar5;
    config_info_02.use_type = (char)(uVar5 >> 0x20);
    config_info_02._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_02.dictionary_type = (int)uVar6;
    config_info_02.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_02._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &OpenAddressHash<int,_int>::openDictionary(config_info_02,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_skip_list_t:
    config_info_01.key_size = actual;
    config_info_01.type = iVar2;
    config_info_01.dictionary_size = iVar3;
    config_info_01.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_01.id = (int)uVar5;
    config_info_01.use_type = (char)(uVar5 >> 0x20);
    config_info_01._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_01.dictionary_type = (int)uVar6;
    config_info_01.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_01._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &SkipList<int,_int>::openDictionary(config_info_01,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_linear_hash_t:
    config_info_04.key_size = actual;
    config_info_04.type = iVar2;
    config_info_04.dictionary_size = iVar3;
    config_info_04.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_04.id = (int)uVar5;
    config_info_04.use_type = (char)(uVar5 >> 0x20);
    config_info_04._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_04.dictionary_type = (int)uVar6;
    config_info_04.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_04._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &LinearHash<int,_int>::openDictionary(config_info_04,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_error_t:
    config_info_05.key_size = actual;
    config_info_05.type = iVar2;
    config_info_05.dictionary_size = iVar3;
    config_info_05.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_05.id = (int)uVar5;
    config_info_05.use_type = (char)(uVar5 >> 0x20);
    config_info_05._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_05.dictionary_type = (int)uVar6;
    config_info_05.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_05._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &SkipList<int,_int>::openDictionary(config_info_05,0,0)->
                    super_Dictionary<int,_int>;
    (_value_local->last_status).error = '\x12';
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(_value_local->last_status).error,200,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,(((_value_local->dict).instance)->record).key_size,actual,0xc9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,(((_value_local->dict).instance)->record).value_size,actual_00,0xca,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  cpp_wrapper_get(tc,_value_local,key,value,'\0',1);
  cpp_wrapper_get(tc,_value_local,key + 10,value + 10,'\0',1);
  cpp_wrapper_update(tc,_value_local,key,value + 1,'\0',1,'\x01');
  pDVar9 = _value_local;
  cpp_wrapper_update(tc,_value_local,key + -10,value + -10,'\0',1,'\x01');
  iVar8 = Dictionary<int,_int>::close(_value_local,(int)pDVar9);
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(char)iVar8,0xd9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  switch(iVar4) {
  case dictionary_type_bpp_tree_t:
    config_info_06.key_size = actual;
    config_info_06.type = iVar2;
    config_info_06.dictionary_size = iVar3;
    config_info_06.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_06.id = (int)uVar5;
    config_info_06.use_type = (char)(uVar5 >> 0x20);
    config_info_06._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_06.dictionary_type = (int)uVar6;
    config_info_06.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_06._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &BppTree<int,_int>::openDictionary(config_info_06,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_flat_file_t:
    config_info_07.key_size = actual;
    config_info_07.type = iVar2;
    config_info_07.dictionary_size = iVar3;
    config_info_07.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_07.id = (int)uVar5;
    config_info_07.use_type = (char)(uVar5 >> 0x20);
    config_info_07._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_07.dictionary_type = (int)uVar6;
    config_info_07.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_07._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &FlatFile<int,_int>::openDictionary(config_info_07,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_open_address_file_hash_t:
    config_info_10.key_size = actual;
    config_info_10.type = iVar2;
    config_info_10.dictionary_size = iVar3;
    config_info_10.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_10.id = (int)uVar5;
    config_info_10.use_type = (char)(uVar5 >> 0x20);
    config_info_10._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_10.dictionary_type = (int)uVar6;
    config_info_10.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_10._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &OpenAddressFileHash<int,_int>::openDictionary(config_info_10,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_open_address_hash_t:
    config_info_09.key_size = actual;
    config_info_09.type = iVar2;
    config_info_09.dictionary_size = iVar3;
    config_info_09.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_09.id = (int)uVar5;
    config_info_09.use_type = (char)(uVar5 >> 0x20);
    config_info_09._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_09.dictionary_type = (int)uVar6;
    config_info_09.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_09._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &OpenAddressHash<int,_int>::openDictionary(config_info_09,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_skip_list_t:
    config_info_08.key_size = actual;
    config_info_08.type = iVar2;
    config_info_08.dictionary_size = iVar3;
    config_info_08.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_08.id = (int)uVar5;
    config_info_08.use_type = (char)(uVar5 >> 0x20);
    config_info_08._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_08.dictionary_type = (int)uVar6;
    config_info_08.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_08._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &SkipList<int,_int>::openDictionary(config_info_08,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_linear_hash_t:
    config_info_11.key_size = actual;
    config_info_11.type = iVar2;
    config_info_11.dictionary_size = iVar3;
    config_info_11.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_11.id = (int)uVar5;
    config_info_11.use_type = (char)(uVar5 >> 0x20);
    config_info_11._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_11.dictionary_type = (int)uVar6;
    config_info_11.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_11._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &LinearHash<int,_int>::openDictionary(config_info_11,0,0)->
                    super_Dictionary<int,_int>;
    break;
  case dictionary_type_error_t:
    config_info_12.key_size = actual;
    config_info_12.type = iVar2;
    config_info_12.dictionary_size = iVar3;
    config_info_12.value_size = actual_00;
    uVar6 = CONCAT44(config.dictionary_size,iVar4) & 0xffffff00ffffffff;
    uVar5 = CONCAT44(type,iVar1) & 0xffffff00ffffffff;
    config_info_12.id = (int)uVar5;
    config_info_12.use_type = (char)(uVar5 >> 0x20);
    config_info_12._5_3_ = (int3)(uVar5 >> 0x28);
    config_info_12.dictionary_type = (int)uVar6;
    config_info_12.dictionary_status = (char)(uVar6 >> 0x20);
    config_info_12._29_3_ = (int3)(uVar6 >> 0x28);
    _value_local = &SkipList<int,_int>::openDictionary(config_info_12,0,0)->
                    super_Dictionary<int,_int>;
    (_value_local->last_status).error = '\x12';
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(_value_local->last_status).error,0x101,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,(((_value_local->dict).instance)->record).key_size,actual,0x102,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar7 = planck_unit_assert_int_are_equal
                    (tc,(((_value_local->dict).instance)->record).value_size,actual_00,0x103,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar7 != '\0') {
    cpp_wrapper_get(tc,_value_local,key,value + 1,'\0',1);
    cpp_wrapper_get(tc,_value_local,key + 10,value + 10,'\0',1);
    cpp_wrapper_get(tc,_value_local,key + -10,value + -10,'\0',1);
    if (_value_local != (Dictionary<int,_int> *)0x0) {
      Dictionary<int,_int>::~Dictionary(_value_local);
      operator_delete(_value_local);
    }
    return;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_static_open_close_complex(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int value
) {
	ion_err_t				error;
	ion_dictionary_id_t		gdict_id	= dict->dict.instance->id;
	ion_key_size_t			key_size	= dict->dict.instance->record.key_size;
	ion_value_size_t		val_size	= dict->dict.instance->record.value_size;
	ion_key_type_t			key_type	= dict->dict.instance->key_type;
	ion_dictionary_size_t	dict_size	= dict->dict_size;
	ion_dictionary_type_t	dict_type	= dict->dict.instance->type;

	/* Insert test records so we can check data integrity after we close/open */
	cpp_wrapper_insert(tc, dict, key, value, boolean_false);
	cpp_wrapper_insert(tc, dict, key + 10, value + 10, boolean_false);

	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);
	cpp_wrapper_get(tc, dict, key - 10, value - 10, err_item_not_found, 0);

	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	ion_dictionary_config_info_t config = {
		gdict_id, 0, key_type, key_size, val_size, dict_size, dict_type
	};

	int type = 0;

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);

	/* Update one test record */
	cpp_wrapper_update(tc, dict, key, value + 1, err_ok, 1, boolean_true);

	/* Try and update a record that does not exist. We expect an upsert to occur. */
	cpp_wrapper_update(tc, dict, key - 10, value - 10, err_ok, 1, boolean_true);

	/* Close dictionary again. */
	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test records. */
	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value + 1, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);
	cpp_wrapper_get(tc, dict, key - 10, value - 10, err_ok, 1);

	delete dict;
}